

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int __thiscall
fmt::v9::detail::digit_grouping<char>::next(digit_grouping<char> *this,next_state *state)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = 0x7fffffff;
  if ((this->sep_).thousands_sep != '\0') {
    pcVar2 = (this->sep_).grouping._M_dataplus._M_p + (this->sep_).grouping._M_string_length;
    pcVar3 = (state->group)._M_current;
    if (pcVar3 == pcVar2) {
      pcVar3 = pcVar2 + -1;
    }
    else {
      if ((byte)(*pcVar3 + 0x81U) < 0x82) {
        return 0x7fffffff;
      }
      (state->group)._M_current = pcVar3 + 1;
    }
    iVar1 = (int)*pcVar3 + state->pos;
    state->pos = iVar1;
  }
  return iVar1;
}

Assistant:

int next(next_state& state) const {
    if (!sep_.thousands_sep) return max_value<int>();
    if (state.group == sep_.grouping.end())
      return state.pos += sep_.grouping.back();
    if (*state.group <= 0 || *state.group == max_value<char>())
      return max_value<int>();
    state.pos += *state.group++;
    return state.pos;
  }